

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseNullCoalesce(Parser *this)

{
  bool bVar1;
  uint uVar2;
  Node *pNVar3;
  size_type sVar4;
  reference ppNVar5;
  socklen_t *in_RCX;
  sockaddr *__addr;
  Parser *in_RDI;
  int i;
  Node *res;
  Node *n;
  vector<Token_*,_std::allocator<Token_*>_> opTokens;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  value_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<Token_*,_std::allocator<Token_*>_> local_40;
  Parser *in_stack_ffffffffffffffe8;
  value_type local_8;
  
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x127826);
  std::vector<Token_*,_std::allocator<Token_*>_>::vector
            ((vector<Token_*,_std::allocator<Token_*>_> *)0x127830);
  do {
    pNVar3 = parseOr(in_stack_ffffffffffffffe8);
    if (pNVar3 == (Node *)0x0) {
LAB_001278cf:
      bVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                        ((vector<Node_*,_std::allocator<Node_*>_> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (bVar1) {
        local_8 = (value_type)0x0;
      }
      else {
        sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)&stack0xffffffffffffffd8);
        if (sVar4 == 1) {
          ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)&stack0xffffffffffffffd8,0
                              );
          local_8 = *ppNVar5;
        }
        else {
          ppNVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)&stack0xffffffffffffffd8,0
                              );
          local_8 = *ppNVar5;
          in_stack_ffffffffffffff84 = 1;
          while (iVar6 = in_stack_ffffffffffffff84,
                sVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                                   &stack0xffffffffffffffd8), in_stack_ffffffffffffff84 < (int)sVar4
                ) {
            std::vector<Token_*,_std::allocator<Token_*>_>::operator[](&local_40,(long)(iVar6 + -1))
            ;
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                      ((vector<Node_*,_std::allocator<Node_*>_> *)&stack0xffffffffffffffd8,
                       (long)iVar6);
            local_8 = createBinaryOpNode((Parser *)
                                         CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),(Token *)local_8,
                                         (Node *)CONCAT44(iVar6,in_stack_ffffffffffffff98),
                                         (Node *)in_RDI);
            in_stack_ffffffffffffff84 = iVar6 + 1;
          }
        }
      }
      std::vector<Token_*,_std::allocator<Token_*>_>::~vector
                ((vector<Token_*,_std::allocator<Token_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      return local_8;
    }
    uVar2 = accept(in_RDI,0x34,__addr,in_RCX);
    if ((uVar2 & 1) == 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      goto LAB_001278cf;
    }
    std::vector<Token_*,_std::allocator<Token_*>_>::push_back
              ((vector<Token_*,_std::allocator<Token_*>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (value_type *)in_stack_ffffffffffffff78);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  } while( true );
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }